

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdjs_json_mapping_api.cpp
# Opt level: O0

json * __thiscall
cfd::js::api::json::
ExecuteJsonApi<cfd::js::api::json::ConvertToPsbtRequest,cfd::js::api::json::PsbtOutputData,cfd::js::api::ConvertToPsbtRequestStruct,cfd::js::api::PsbtOutputDataStruct>
          (json *this,string *request_message,
          function<cfd::js::api::PsbtOutputDataStruct_(const_cfd::js::api::ConvertToPsbtRequestStruct_&)>
          *call_function)

{
  ErrorResponse local_520;
  JsonClassBase<cfd::js::api::json::ErrorResponseBase> local_468 [4];
  JsonClassBase<cfd::js::api::json::PsbtOutputData> local_448 [4];
  undefined1 local_428 [8];
  PsbtOutputData res_2;
  undefined1 local_3a8 [8];
  PsbtOutputDataStruct response;
  ConvertToPsbtRequestStruct request;
  ErrorResponse res_1;
  CfdException *cfd_except;
  ErrorResponse res;
  CfdException ex;
  undefined1 local_80 [8];
  ConvertToPsbtRequest req;
  function<cfd::js::api::PsbtOutputDataStruct_(const_cfd::js::api::ConvertToPsbtRequestStruct_&)>
  *call_function_local;
  string *request_message_local;
  string *json_message;
  
  req._88_8_ = call_function;
  ConvertToPsbtRequest::ConvertToPsbtRequest((ConvertToPsbtRequest *)local_80);
  core::JsonClassBase<cfd::js::api::json::ConvertToPsbtRequest>::Deserialize
            ((JsonClassBase<cfd::js::api::json::ConvertToPsbtRequest> *)local_80,request_message);
  ConvertToPsbtRequest::ConvertToStruct
            ((ConvertToPsbtRequestStruct *)
             &response.ignore_items._M_t._M_impl.super__Rb_tree_header._M_node_count,
             (ConvertToPsbtRequest *)local_80);
  std::
  function<cfd::js::api::PsbtOutputDataStruct_(const_cfd::js::api::ConvertToPsbtRequestStruct_&)>::
  operator()((PsbtOutputDataStruct *)local_3a8,call_function,
             (ConvertToPsbtRequestStruct *)
             &response.ignore_items._M_t._M_impl.super__Rb_tree_header._M_node_count);
  res_2._119_1_ = 0;
  std::__cxx11::string::string((string *)this);
  if (response._56_4_ == 0) {
    PsbtOutputData::PsbtOutputData((PsbtOutputData *)local_428);
    PsbtOutputData::ConvertFromStruct((PsbtOutputData *)local_428,(PsbtOutputDataStruct *)local_3a8)
    ;
    core::JsonClassBase<cfd::js::api::json::PsbtOutputData>::Serialize_abi_cxx11_(local_448);
    std::__cxx11::string::operator=((string *)this,(string *)local_448);
    std::__cxx11::string::~string((string *)local_448);
    PsbtOutputData::~PsbtOutputData((PsbtOutputData *)local_428);
  }
  else {
    ErrorResponse::ConvertFromStruct(&local_520,(InnerErrorResponseStruct *)&response.field_0x38);
    core::JsonClassBase<cfd::js::api::json::ErrorResponseBase>::Serialize_abi_cxx11_(local_468);
    std::__cxx11::string::operator=((string *)this,(string *)local_468);
    std::__cxx11::string::~string((string *)local_468);
    ErrorResponse::~ErrorResponse(&local_520);
  }
  res_2._119_1_ = 1;
  PsbtOutputDataStruct::~PsbtOutputDataStruct((PsbtOutputDataStruct *)local_3a8);
  ConvertToPsbtRequestStruct::~ConvertToPsbtRequestStruct
            ((ConvertToPsbtRequestStruct *)
             &response.ignore_items._M_t._M_impl.super__Rb_tree_header._M_node_count);
  ConvertToPsbtRequest::~ConvertToPsbtRequest((ConvertToPsbtRequest *)local_80);
  return this;
}

Assistant:

std::string ExecuteJsonApi(
    const std::string &request_message,
    std::function<ResponseStructType(const RequestStructType &)>
        call_function) {
  // リクエストjson_strから、モデルへ変換
  RequestType req;
  try {
    req.Deserialize(request_message);
  } catch (const CfdException &cfd_except) {
    ErrorResponse res = ErrorResponse::ConvertFromCfdException(cfd_except);
    return res.Serialize();
  } catch (...) {
    CfdException ex(
        CfdError::kCfdOutOfRangeError,
        "JSON value convert error. Value out of range.");
    ErrorResponse res = ErrorResponse::ConvertFromCfdException(ex);
    return res.Serialize();
  }
  RequestStructType request = req.ConvertToStruct();
  ResponseStructType response = call_function(request);
  std::string json_message;
  if (response.error.code == 0) {
    ResponseType res;
    res.ConvertFromStruct(response);
    json_message = res.Serialize();
  } else {
    json_message =
        ErrorResponse::ConvertFromStruct(response.error).Serialize();
  }

  // utf-8
  return json_message;
}